

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

long * __thiscall
google::protobuf::RepeatedField<long>::AddAlreadyReserved(RepeatedField<long> *this)

{
  int iVar1;
  long *plVar2;
  int *in_RDI;
  RepeatedField<long> *in_stack_fffffffffffffff0;
  
  plVar2 = elements(in_stack_fffffffffffffff0);
  iVar1 = *in_RDI;
  *in_RDI = iVar1 + 1;
  return plVar2 + iVar1;
}

Assistant:

inline Element* RepeatedField<Element>::AddAlreadyReserved() {
  GOOGLE_DCHECK_LT(current_size_, total_size_);
  return &elements()[current_size_++];
}